

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O1

jsparser_ctx * ctemplate_htmlparser::jsparser_new(void)

{
  jsparser_ctx *user;
  statemachine_definition *def;
  statemachine_ctx *psVar1;
  
  user = (jsparser_ctx *)calloc(1,0x30);
  if (user != (jsparser_ctx *)0x0) {
    def = statemachine_definition_new(0x10);
    if (def == (statemachine_definition *)0x0) {
      def = (statemachine_definition *)0x0;
    }
    else {
      statemachine_definition_populate
                (def,(int **)jsparser_state_transitions,(char **)jsparser_states_internal_names);
      statemachine_in_state(def,0,in_state_js_text);
      statemachine_enter_state(def,5,enter_state_js_slash);
      statemachine_enter_state(def,0xe,enter_state_js_comment_after);
    }
    user->statemachine_def = def;
    if (def != (statemachine_definition *)0x0) {
      psVar1 = statemachine_new(def,user);
      user->statemachine = psVar1;
      if (psVar1 != (statemachine_ctx *)0x0) {
        psVar1->current_state = 0;
        user->buffer_start = 0;
        user->buffer_end = 0;
        return user;
      }
    }
  }
  return (jsparser_ctx *)0x0;
}

Assistant:

jsparser_ctx *jsparser_new()
{
    jsparser_ctx *js;

    js = CAST(jsparser_ctx *, calloc(1, sizeof(jsparser_ctx)));
    if (js == NULL)
      return NULL;

    js->statemachine_def = create_statemachine_definition();
    if (js->statemachine_def == NULL)
      return NULL;

    js->statemachine = statemachine_new(js->statemachine_def, js);
    if (js->statemachine == NULL)
      return NULL;

    jsparser_reset(js);

    return js;
}